

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_mutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,signature *sig,
          sequence_number seq,public_key *pk,span<const_char> salt,address *addr)

{
  int32_t *piVar1;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  _Rb_tree_node_base *p_Var4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  undefined8 uVar9;
  _Base_ptr p_Var10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  _Base_ptr p_Var14;
  _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
  *this_00;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  uint uVar17;
  long lVar19;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *ids;
  undefined1 *puVar20;
  _Link_type p_Var21;
  uchar *puVar22;
  uint uVar23;
  _Base_ptr *pp_Var24;
  _Rb_tree_node_base *p_Var25;
  bool bVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  span<const_char> buf_00;
  span<const_char> buf_01;
  uint *local_288;
  _Base_ptr p_Stack_280;
  uint local_278;
  undefined4 uStack_274;
  _Base_ptr local_270;
  undefined1 local_268 [144];
  undefined1 local_1d8 [112];
  uchar local_168 [8];
  _Base_ptr local_160;
  _Base_ptr p_Stack_158;
  _Base_ptr local_150;
  undefined1 local_148 [144];
  uchar local_b8 [8];
  uchar auStack_b0 [8];
  uchar local_a8 [8];
  uchar auStack_a0 [8];
  uchar local_98 [8];
  uchar auStack_90 [8];
  uchar local_88 [8];
  undefined8 uStack_80;
  int64_t local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  _Base_ptr local_50;
  uchar local_48 [8];
  undefined1 local_40;
  undefined7 uStack_3f;
  _Base_ptr p_Stack_38;
  char *pcVar18;
  
  buf_00.m_len = (char *)buf.m_len;
  bVar27 = 0;
  p_Var14 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header;
  p_Var16 = &p_Var2->_M_header;
  if (p_Var14 != (_Rb_tree_node_base *)0x0) {
    do {
      lVar19 = 0;
      do {
        uVar17 = *(uint *)((long)&p_Var14[1]._M_color + lVar19);
        uVar23 = *(uint *)((long)(target->m_number)._M_elems + lVar19);
        if (uVar17 != uVar23) break;
        bVar26 = lVar19 != 0x10;
        lVar19 = lVar19 + 4;
      } while (bVar26);
      bVar26 = (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18)
               < (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                 uVar23 << 0x18);
      if (!bVar26) {
        p_Var16 = p_Var14;
      }
      p_Var14 = (&p_Var14->_M_left)[bVar26];
    } while (p_Var14 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var16 != p_Var2) {
      lVar19 = 0;
      do {
        uVar17 = *(uint *)((long)(target->m_number)._M_elems + lVar19);
        uVar23 = *(uint *)((long)&p_Var16[1]._M_color + lVar19);
        if (uVar17 != uVar23) break;
        bVar26 = lVar19 != 0x10;
        lVar19 = lVar19 + 4;
      } while (bVar26);
      if ((uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18) <
          (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18)) {
        p_Var16 = &p_Var2->_M_header;
      }
      if ((_Rb_tree_header *)p_Var16 != p_Var2) {
        if ((long)p_Var16[8]._M_left < seq.value) {
          buf_00.m_ptr = buf_00.m_len;
          set_value((anon_unknown_0 *)&p_Var16[1]._M_right,(dht_immutable_item *)buf.m_ptr,buf_00);
          p_Var16[8]._M_left = (_Base_ptr)seq.value;
          p_Var14 = *(_Base_ptr *)((sig->bytes)._M_elems + 8);
          uVar5 = *(undefined8 *)((sig->bytes)._M_elems + 0x10);
          p_Var6 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x18);
          p_Var7 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x20);
          p_Var8 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x28);
          uVar9 = *(undefined8 *)((sig->bytes)._M_elems + 0x30);
          p_Var10 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x38);
          p_Var16[6]._M_left = *(_Base_ptr *)(sig->bytes)._M_elems;
          p_Var16[6]._M_right = p_Var14;
          *(undefined8 *)(p_Var16 + 7) = uVar5;
          p_Var16[7]._M_parent = p_Var6;
          p_Var16[7]._M_left = p_Var7;
          p_Var16[7]._M_right = p_Var8;
          *(undefined8 *)(p_Var16 + 8) = uVar9;
          p_Var16[8]._M_parent = p_Var10;
        }
        goto LAB_003aa58d;
      }
    }
  }
  sVar11 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar18 = buf_00.m_len;
  iVar12 = (*this->m_settings->_vptr_settings_interface[5])();
  if (iVar12 <= (int)sVar11) {
    p_Var16 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var16 != p_Var2) &&
       (auVar28 = ::std::_Rb_tree_increment(p_Var16), (_Rb_tree_header *)auVar28._0_8_ != p_Var2)) {
      do {
        p_Var15 = auVar28._0_8_;
        iVar12 = min_distance_exp((dht *)(p_Var15 + 1),(node_id *)&this->m_node_ids,auVar28._8_8_);
        iVar13 = min_distance_exp((dht *)(p_Var16 + 1),(node_id *)&this->m_node_ids,ids);
        uVar17 = *(int *)&p_Var15[6]._M_parent / 5 - iVar12;
        pcVar18 = (char *)(ulong)uVar17;
        if ((int)uVar17 < *(int *)&p_Var16[6]._M_parent / 5 - iVar13) {
          p_Var16 = p_Var15;
        }
        auVar28 = ::std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)auVar28._0_8_ != p_Var2);
    }
    p_Var21 = (_Link_type)p_Var2;
    this_00 = (_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
               *)::std::_Rb_tree_rebalance_for_erase(p_Var16,&p_Var2->_M_header);
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
    ::_M_drop_node(this_00,p_Var21);
    psVar3 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 - 1;
    piVar1 = &(this->m_counters).mutable_data;
    *piVar1 = *piVar1 + -1;
  }
  memset((anon_unknown_0 *)&local_150,0,0x100);
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_40 = _S_red;
  buf_01.m_len = (difference_type)pcVar18;
  buf_01.m_ptr = buf_00.m_len;
  local_50 = (_Base_ptr)&local_40;
  set_value((anon_unknown_0 *)&local_150,(dht_immutable_item *)buf.m_ptr,buf_01);
  local_288 = &local_278;
  local_78 = seq.value;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,salt.m_ptr,salt.m_ptr + salt.m_len);
  ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_288);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT44(uStack_274,local_278) + 1);
  }
  local_b8 = *(uchar (*) [8])(sig->bytes)._M_elems;
  auStack_b0 = *(uchar (*) [8])((sig->bytes)._M_elems + 8);
  local_a8 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x10);
  auStack_a0 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x18);
  local_98 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x20);
  auStack_90 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x28);
  local_88 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x30);
  uStack_80 = *(undefined8 *)((sig->bytes)._M_elems + 0x38);
  local_70 = *(undefined8 *)(pk->bytes)._M_elems;
  uStack_68 = *(undefined8 *)((pk->bytes)._M_elems + 8);
  local_60 = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
  uStack_58 = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
  local_278 = (target->m_number)._M_elems[4];
  local_288 = *(uint **)(target->m_number)._M_elems;
  p_Stack_280 = *(_Base_ptr *)((target->m_number)._M_elems + 2);
  local_270 = local_150;
  local_150 = (_Base_ptr)0x0;
  memcpy(local_268,local_148,0x90);
  puVar22 = local_b8;
  p_Var21 = (_Link_type)local_1d8;
  for (lVar19 = 0xd; lVar19 != 0; lVar19 = lVar19 + -1) {
    *(undefined8 *)&p_Var21->super__Rb_tree_node_base = *(undefined8 *)puVar22;
    puVar22 = puVar22 + ((ulong)bVar27 * -2 + 1) * 8;
    p_Var21 = (_Link_type)((long)p_Var21 + (ulong)bVar27 * -0x10 + 8);
  }
  if (local_50 == (_Base_ptr)&local_40) {
    p_Stack_158 = p_Stack_38;
    local_1d8._104_8_ = (_Base_ptr)&local_160;
  }
  else {
    local_1d8._104_8_ = local_50;
  }
  local_160 = (_Base_ptr)CONCAT71(uStack_3f,local_40);
  local_168[0] = local_48[0];
  local_168[1] = local_48[1];
  local_168[2] = local_48[2];
  local_168[3] = local_48[3];
  local_168[4] = local_48[4];
  local_168[5] = local_48[5];
  local_168[6] = local_48[6];
  local_168[7] = local_48[7];
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_40 = _S_red;
  local_50 = (_Base_ptr)&local_40;
  p_Var15 = (_Rb_tree_node_base *)operator_new(0x158);
  *(uint *)&p_Var15[1]._M_left = local_278;
  *(uint **)(p_Var15 + 1) = local_288;
  p_Var15[1]._M_parent = p_Stack_280;
  p_Var15[1]._M_right = local_270;
  local_270 = (_Base_ptr)0x0;
  memcpy(p_Var15 + 2,local_268,0x90);
  p_Var21 = (_Link_type)local_1d8;
  pp_Var24 = &p_Var15[6]._M_left;
  for (lVar19 = 0xd; lVar19 != 0; lVar19 = lVar19 + -1) {
    *pp_Var24 = *(_Base_ptr *)&p_Var21->super__Rb_tree_node_base;
    p_Var21 = (_Link_type)((long)p_Var21 + (ulong)bVar27 * -0x10 + 8);
    pp_Var24 = pp_Var24 + (ulong)bVar27 * -2 + 1;
  }
  p_Var15[9]._M_right = (_Base_ptr)&p_Var15[10]._M_parent;
  if ((_Base_ptr)local_1d8._104_8_ == (_Base_ptr)&local_160) {
    p_Var15[10]._M_parent = local_160;
    p_Var15[10]._M_left = p_Stack_158;
  }
  else {
    p_Var15[9]._M_right = (_Base_ptr)local_1d8._104_8_;
    p_Var15[10]._M_parent = local_160;
  }
  *(uchar (*) [8])(p_Var15 + 10) = local_168;
  local_168[0] = '\0';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_168[4] = '\0';
  local_168[5] = '\0';
  local_168[6] = '\0';
  local_168[7] = '\0';
  local_160 = (_Base_ptr)((ulong)local_160 & 0xffffffffffffff00);
  p_Var4 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var25 = &p_Var2->_M_header;
  if (p_Var4 == (_Rb_tree_node_base *)0x0) {
LAB_003aa498:
    local_1d8._104_8_ = (_Base_ptr)&local_160;
    if (p_Var25 != (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var16 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var25);
      goto LAB_003aa4b0;
    }
LAB_003aa4d5:
    if (p_Var2 == (_Rb_tree_header *)p_Var25) {
      bVar26 = true;
    }
    else {
      lVar19 = 0;
      do {
        uVar17 = *(uint *)((long)&p_Var15[1]._M_color + lVar19);
        uVar23 = *(uint *)((long)&p_Var25[1]._M_color + lVar19);
        if (uVar17 != uVar23) break;
        bVar26 = lVar19 != 0x10;
        lVar19 = lVar19 + 4;
      } while (bVar26);
      bVar26 = (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18)
               < (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                 uVar23 << 0x18);
    }
    ::std::_Rb_tree_insert_and_rebalance(bVar26,p_Var15,p_Var25,&p_Var2->_M_header);
    psVar3 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 + 1;
    p_Var16 = p_Var15;
  }
  else {
    do {
      p_Var16 = p_Var4;
      puVar20 = (undefined1 *)0x20;
      do {
        uVar17 = *(uint *)((long)&p_Var15->_M_color + (long)puVar20);
        uVar23 = *(uint *)((long)&p_Var16->_M_color + (long)puVar20);
        if (uVar17 != uVar23) break;
        p_Var21 = (_Link_type)(puVar20 + 4);
        bVar26 = puVar20 != &DAT_00000030;
        puVar20 = (undefined1 *)p_Var21;
      } while (bVar26);
      uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
      uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
      p_Var4 = (&p_Var16->_M_left)[uVar23 <= uVar17];
    } while ((&p_Var16->_M_left)[uVar23 <= uVar17] != (_Base_ptr)0x0);
    p_Var25 = p_Var16;
    local_1d8._104_8_ = (_Base_ptr)&local_160;
    if (uVar17 < uVar23) goto LAB_003aa498;
LAB_003aa4b0:
    puVar20 = (undefined1 *)0x20;
    do {
      uVar17 = *(uint *)((long)&p_Var16->_M_color + (long)puVar20);
      uVar23 = *(uint *)((long)&p_Var15->_M_color + (long)puVar20);
      if (uVar17 != uVar23) break;
      p_Var21 = (_Link_type)(puVar20 + 4);
      bVar26 = puVar20 != &DAT_00000030;
      puVar20 = (undefined1 *)p_Var21;
    } while (bVar26);
    if ((uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18) <
        (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18))
    goto LAB_003aa4d5;
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
    ::_M_drop_node((_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
                    *)p_Var15,p_Var21);
  }
  if ((_Base_ptr)local_1d8._104_8_ != (_Base_ptr)&local_160) {
    operator_delete((void *)local_1d8._104_8_,(long)local_160 + 1);
  }
  if (local_270 != (_Base_ptr)0x0) {
    operator_delete__(local_270);
  }
  piVar1 = &(this->m_counters).mutable_data;
  *piVar1 = *piVar1 + 1;
  if (local_50 != (_Base_ptr)&local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_150 != (_Base_ptr)0x0) {
    operator_delete__(local_150);
  }
LAB_003aa58d:
  touch_item((dht_immutable_item *)&p_Var16[1]._M_right,addr);
  return;
}

Assistant:

void put_mutable_item(sha1_hash const& target
			, span<char const> buf
			, signature const& sig
			, sequence_number const seq
			, public_key const& pk
			, span<char const> salt
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_mutable_table.find(target);
			if (i == m_mutable_table.end())
			{
				// this is the case where we don't have an item in this slot
				// make sure we don't add too many items
				if (int(m_mutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_mutable_table);

					TORRENT_ASSERT(j != m_mutable_table.end());
					m_mutable_table.erase(j);
					m_counters.mutable_data -= 1;
				}
				dht_mutable_item to_add;
				set_value(to_add, buf);
				to_add.seq = seq;
				to_add.salt = {salt.begin(), salt.end()};
				to_add.sig = sig;
				to_add.key = pk;

				std::tie(i, std::ignore) = m_mutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.mutable_data += 1;
			}
			else
			{
				// this is the case where we already have an item in this slot
				dht_mutable_item& item = i->second;

				if (item.seq < seq)
				{
					set_value(item, buf);
					item.seq = seq;
					item.sig = sig;
				}
			}

			touch_item(i->second, addr);
		}